

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  undefined1 *puVar3;
  long lVar4;
  functest *pp_Var5;
  int iVar6;
  bool bVar7;
  
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  xmlInitParser();
  xmlInitializeCatalog();
  iVar6 = 0;
  xmlCatalogSetDefaults(0);
  iVar1 = xmlRegisterInputCallbacks(hugeMatch,hugeOpen,hugeRead,hugeClose);
  if (iVar1 < 0) {
    fwrite("failed to register Huge handler\n",0x20,1,_stderr);
    exit(1);
  }
  lVar4 = 1;
  do {
    if (argc <= lVar4) {
      if (iVar6 == 0) {
        for (lVar4 = 0; lVar4 != 0xb; lVar4 = lVar4 + 1) {
          runtest((int)lVar4);
        }
      }
      bVar7 = nb_errors != 0 || nb_leaks != 0;
      if (bVar7) {
        printf("Total %d tests, %d errors, %d leaks\n",(ulong)(uint)nb_tests);
      }
      else {
        printf("Total %d tests, no errors\n",(ulong)(uint)nb_tests);
      }
      xmlCleanupParser();
      return (uint)bVar7;
    }
    pcVar2 = argv[lVar4];
    if (((*pcVar2 == '-') && (pcVar2[1] == 'v')) && (puVar3 = &verbose, pcVar2[2] == '\0')) {
LAB_001023dc:
      *puVar3 = 1;
    }
    else {
      iVar1 = strcmp(pcVar2,"-quiet");
      puVar3 = &tests_quiet;
      if (iVar1 == 0) goto LAB_001023dc;
      iVar1 = 0;
      for (pp_Var5 = &testDescriptions[0].func; *pp_Var5 != (functest)0x0; pp_Var5 = pp_Var5 + 7) {
        pcVar2 = strstr(((testDesc *)(pp_Var5 + -1))->desc,argv[lVar4]);
        if (pcVar2 != (char *)0x0) {
          runtest(iVar1);
          iVar6 = iVar6 + 1;
        }
        iVar1 = iVar1 + 1;
      }
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

int
main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    int i, a, ret = 0;
    int subset = 0;

    initializeLibxml2();

    for (a = 1; a < argc;a++) {
        if (!strcmp(argv[a], "-v"))
	    verbose = 1;
        else if (!strcmp(argv[a], "-quiet"))
	    tests_quiet = 1;
	else {
	    for (i = 0; testDescriptions[i].func != NULL; i++) {
	        if (strstr(testDescriptions[i].desc, argv[a])) {
		    ret += runtest(i);
		    subset++;
		}
	    }
	}
    }
    if (subset == 0) {
	for (i = 0; testDescriptions[i].func != NULL; i++) {
	    ret += runtest(i);
	}
    }
    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
        ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
    }
    xmlCleanupParser();

    return(ret);
}